

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_minimal_logger__on_delete(fct_logger_i *self_,fct_logger_evt_t *e)

{
  _func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *p_Var1;
  
  if (self_[1].vtable.on_test_end != (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0) {
    p_Var1 = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    do {
      free(*(void **)(self_[1].vtable.on_chk + (long)p_Var1 * 8));
      p_Var1 = p_Var1 + 1;
    } while (p_Var1 != self_[1].vtable.on_test_end);
  }
  self_[1].vtable.on_test_end = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
  free(self_[1].vtable.on_chk);
  free(self_);
  return;
}

Assistant:

static void
fct_minimal_logger__on_delete(
    fct_logger_i *self_,
    fct_logger_evt_t const *e
)
{
    fct_minimal_logger_t *self = (fct_minimal_logger_t*)self_;
    fct_unused(e);
    fct_nlist__final(&(self->failed_cndtns_list), free);
    free(self);

}